

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O0

void __thiscall Holding::~Holding(Holding *this)

{
  Holding *this_local;
  
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b360;
  if (this->subHolding != (Holding *)0x0) {
    (*(this->subHolding->super_BlackCard).super_Card._vptr_Card[3])();
  }
  if (this->upperHolding != (Holding *)0x0) {
    (*(this->upperHolding->super_BlackCard).super_Card._vptr_Card[3])();
  }
  std::__cxx11::string::~string((string *)&this->name);
  BlackCard::~BlackCard(&this->super_BlackCard);
  return;
}

Assistant:

Holding::~Holding()
{
    delete subHolding;
    delete upperHolding;
}